

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManSpecBuild(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int fDualOut,
                     int fSpeculate,Vec_Int_t *vTrace,Vec_Int_t *vGuide,Vec_Int_t *vMap)

{
  int iVar1;
  int j;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  uint iLitNew;
  Gia_Obj_t *pRepr;
  int fSpeculate_local;
  int fDualOut_local;
  Vec_Int_t *vXorLits_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    return;
  }
  if (fDualOut != 0) {
    iVar1 = Gia_ObjId(p,pObj);
    j = Gia_ObjId(p,pObj_00);
    iVar1 = Gia_ObjDiffColors2(p,iVar1,j);
    if (iVar1 == 0) {
      return;
    }
  }
  uVar4 = pObj_00->Value;
  uVar2 = Gia_ObjPhaseReal(pObj_00);
  uVar3 = Gia_ObjPhaseReal(pObj);
  uVar4 = Abc_LitNotCond(uVar4,uVar2 ^ uVar3);
  if (pObj->Value != uVar4) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Gia_ObjProved(p,iVar1);
    if (iVar1 == 0) {
      if (vTrace != (Vec_Int_t *)0x0) {
        Vec_IntPush(vTrace,1);
      }
      if (vGuide != (Vec_Int_t *)0x0) {
        iVar1 = Vec_IntSize(vTrace);
        iVar1 = Vec_IntEntry(vGuide,iVar1 + -1);
        if (iVar1 == 0) goto LAB_002015cd;
      }
      if (vMap != (Vec_Int_t *)0x0) {
        iVar1 = Gia_ObjId(p,pObj);
        Vec_IntPush(vMap,iVar1);
      }
      iVar1 = Gia_ManHashXor(pNew,pObj->Value,uVar4);
      Vec_IntPush(vXorLits,iVar1);
      goto LAB_002015cd;
    }
  }
  if (vTrace != (Vec_Int_t *)0x0) {
    Vec_IntPush(vTrace,0);
  }
LAB_002015cd:
  if (fSpeculate != 0) {
    pObj->Value = uVar4;
  }
  return;
}

Assistant:

static inline void Gia_ManSpecBuild( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int fDualOut, int fSpeculate, Vec_Int_t * vTrace, Vec_Int_t * vGuide, Vec_Int_t * vMap )
{
    Gia_Obj_t * pRepr;
    unsigned iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( pObj->Value != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 1 );
        if ( vGuide == NULL || Vec_IntEntry( vGuide, Vec_IntSize(vTrace)-1 ) )
        {
            if ( vMap )  
                Vec_IntPush( vMap, Gia_ObjId(p, pObj) );
            Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, pObj->Value, iLitNew) );
        }
    }
    else
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 0 );
    }
    if ( fSpeculate )
        pObj->Value = iLitNew;
}